

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::RunGCProtocol(Alice *this)

{
  rep rVar1;
  ulong uVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> duration;
  time_point stop;
  time_point start;
  int count;
  Alice *this_local;
  
  start.__d.__r._4_4_ = 0;
  stop.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  while ((((this->super_Party).termination_condition ^ 0xffU) & 1) != 0) {
    uVar2 = (ulong)start.__d.__r._4_4_;
    start.__d.__r._4_4_ = start.__d.__r._4_4_ + 1;
    printf("Alice: pc # %d = %ld\n",uVar2,(this->super_Party).pc);
    ObliviousExecute(this);
    ObliviousShuffle(this);
    ObliviousTranslate(this);
  }
  duration.__r = std::chrono::_V2::system_clock::now();
  local_38.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&duration,&stop);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_38);
  printf("Alice: Program Output = %ld\n",(this->super_Party).output);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_30);
  printf("Execution Time = %ld microseconds\n",rVar1);
  return;
}

Assistant:

void Alice::RunGCProtocol()
{
    int count = 0;
    auto start = std::chrono::high_resolution_clock::now();
    while(!termination_condition)
    {
        printf("Alice: pc # %d = %ld\n", count++, pc);
        ObliviousExecute();
        ObliviousShuffle();
        ObliviousTranslate();
    }
    auto stop = std::chrono::high_resolution_clock::now(); 
    auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start);   
    printf("Alice: Program Output = %ld\n", output);   
    printf("Execution Time = %ld microseconds\n", duration.count()); 

}